

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodePushing.cpp
# Opt level: O0

void __thiscall wasm::LocalAnalyzer::analyze(LocalAnalyzer *this,Function *func)

{
  size_t __n;
  reference pvVar1;
  vector<bool,_std::allocator<bool>_> *this_00;
  iterator iVar2;
  iterator iVar3;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference local_98;
  uint local_88;
  bool local_81;
  Index i;
  uint local_78;
  _Bit_type *local_70;
  uint local_68;
  _Bit_type *local_60;
  uint local_58;
  _Bit_type *local_50;
  uint local_48;
  iterator local_40;
  _Bit_type *local_30;
  uint local_28;
  size_type local_20;
  size_t num;
  Function *func_local;
  LocalAnalyzer *this_local;
  
  num = (size_t)func;
  func_local = (Function *)this;
  local_20 = Function::getNumLocals(func);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->numSets);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->numSets,local_20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->numGets);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&this->numGets,local_20);
  this_00 = &this->sfa;
  std::vector<bool,_std::allocator<bool>_>::clear(this_00);
  std::vector<bool,_std::allocator<bool>_>::resize(this_00,local_20,false);
  iVar2 = std::vector<bool,_std::allocator<bool>_>::begin(this_00);
  local_50 = iVar2.super__Bit_iterator_base._M_p;
  local_48 = iVar2.super__Bit_iterator_base._M_offset;
  local_40.super__Bit_iterator_base._M_p = local_50;
  local_40.super__Bit_iterator_base._M_offset = local_48;
  __n = Function::getNumParams((Function *)num);
  iVar3 = std::operator+(&local_40,__n);
  local_60 = iVar3.super__Bit_iterator_base._M_p;
  local_58 = iVar3.super__Bit_iterator_base._M_offset;
  local_30 = local_60;
  local_28 = local_58;
  iVar2 = std::vector<bool,_std::allocator<bool>_>::end(this_00);
  _i = iVar2.super__Bit_iterator_base._M_p;
  local_78 = iVar2.super__Bit_iterator_base._M_offset;
  local_81 = true;
  __first.super__Bit_iterator_base._M_offset = local_28;
  __first.super__Bit_iterator_base._M_p = local_30;
  __first.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar2.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar2.super__Bit_iterator_base._0_12_,8);
  local_70 = _i;
  local_68 = local_78;
  std::fill<std::_Bit_iterator,bool>(__first,__last,&local_81);
  Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_>::walk
            ((Walker<wasm::LocalAnalyzer,_wasm::Visitor<wasm::LocalAnalyzer,_void>_> *)this,
             (Expression **)(num + 0x60));
  for (local_88 = 0; local_88 < local_20; local_88 = local_88 + 1) {
    pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->numSets,(ulong)local_88);
    if (*pvVar1 == 0) {
      local_98 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->sfa,(ulong)local_88);
      std::_Bit_reference::operator=(&local_98,false);
    }
  }
  return;
}

Assistant:

void analyze(Function* func) {
    auto num = func->getNumLocals();
    numSets.clear();
    numSets.resize(num);
    numGets.clear();
    numGets.resize(num);
    sfa.clear();
    sfa.resize(num);
    std::fill(sfa.begin() + func->getNumParams(), sfa.end(), true);
    walk(func->body);
    for (Index i = 0; i < num; i++) {
      if (numSets[i] == 0) {
        sfa[i] = false;
      }
    }
  }